

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

double pbrt::funcs::gaussian(Point2f p)

{
  int iVar1;
  double sigma_00;
  double dVar2;
  undefined1 in_ZMM0 [64];
  double sigma;
  double mu;
  anon_class_1_0_00000001 GaussianIntegral;
  anon_class_1_0_00000001 Gaussian;
  double in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  anon_class_1_0_00000001 *this;
  
  vmovlpd_avx(in_ZMM0._0_16_);
  this = (anon_class_1_0_00000001 *)0x3fd0000000000000;
  if (gaussian(pbrt::Point2<float>)::nrm == '\0') {
    iVar1 = __cxa_guard_acquire(&gaussian(pbrt::Point2<float>)::nrm);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 =
           gaussian::anon_class_1_0_00000001::operator()
                     (this,in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      gaussian::nrm = Sqr<double>(in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffc0 = gaussian::nrm;
      __cxa_guard_release(&gaussian(pbrt::Point2<float>)::nrm);
    }
  }
  sigma_00 = gaussian::anon_class_1_0_00000001::operator()
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  dVar2 = gaussian::anon_class_1_0_00000001::operator()
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     sigma_00);
  return (sigma_00 * dVar2) / gaussian::nrm;
}

Assistant:

static double gaussian(Point2f p) {
    auto Gaussian = [](double x, double mu = 0, double sigma = 1) {
        return 1 / std::sqrt(2 * Pi * sigma * sigma) *
               std::exp(-Sqr(x - mu) / (2 * sigma * sigma));
    };
    auto GaussianIntegral = [](double x0, double x1, double mu = 0, double sigma = 1) {
        double sigmaRoot2 = sigma * double(1.414213562373095);
        return 0.5f *
               (std::erf((mu - x0) / sigmaRoot2) - std::erf((mu - x1) / sigmaRoot2));
    };

    double mu = 0.5, sigma = 0.25;
    static double nrm = Sqr(GaussianIntegral(0, 1, mu, sigma));
    return Gaussian(p.x, mu, sigma) * Gaussian(p.y, mu, sigma) / nrm;
}